

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_SurfaceCurvature
ON_SurfaceCurvature::CreateFromGaussianAndMeanCurvatures
          (double gaussian_curvature,double mean_curvature)

{
  double dVar1;
  double dVar2;
  double __x;
  ON_SurfaceCurvature OVar3;
  
  dVar1 = ABS(gaussian_curvature);
  if (((mean_curvature < 1.23432101234321e+308) && (dVar1 < 1.23432101234321e+308)) &&
     (-1.23432101234321e+308 < mean_curvature)) {
    __x = mean_curvature * mean_curvature - gaussian_curvature;
    if (0.0 <= __x) {
      dVar2 = SQRT(__x);
      dVar1 = dVar2;
      if (0.0 > __x) {
        dVar1 = sqrt(__x);
        dVar2 = sqrt(__x);
      }
      dVar1 = dVar1 + mean_curvature;
      mean_curvature = mean_curvature - dVar2;
      goto LAB_0050b1b3;
    }
    if (__x < 0.0) {
      if (gaussian_curvature < 0.0) {
        dVar1 = sqrt(gaussian_curvature);
      }
      else {
        dVar1 = SQRT(gaussian_curvature);
      }
      mean_curvature =
           (double)(~-(ulong)(mean_curvature < 0.0) & (ulong)dVar1 |
                   (ulong)-dVar1 & -(ulong)(mean_curvature < 0.0));
      dVar1 = mean_curvature;
      goto LAB_0050b1b3;
    }
  }
  if (1.23432101234321e+308 <= dVar1) {
    if ((mean_curvature <= -1.23432101234321e+308) ||
       (dVar1 = mean_curvature, 1.23432101234321e+308 <= mean_curvature)) {
      dVar1 = Nan.k1;
      mean_curvature = Nan.k2;
    }
  }
  else {
    dVar1 = SQRT(dVar1);
    mean_curvature =
         (double)(-(ulong)(gaussian_curvature < 0.0) & (ulong)-dVar1 |
                 ~-(ulong)(gaussian_curvature < 0.0) & (ulong)dVar1);
  }
LAB_0050b1b3:
  OVar3.k2 = mean_curvature;
  OVar3.k1 = dVar1;
  return OVar3;
}

Assistant:

const ON_SurfaceCurvature ON_SurfaceCurvature::CreateFromGaussianAndMeanCurvatures(
  double gaussian_curvature,
  double mean_curvature
)
{
  if (ON_IS_VALID(gaussian_curvature) && ON_IS_VALID(mean_curvature))
  {
    const double r = mean_curvature * mean_curvature - gaussian_curvature;
    if (r >= 0.0)
    {
      const double k1 = mean_curvature + sqrt(r);
      const double k2 = mean_curvature - sqrt(r);
      return ON_SurfaceCurvature::CreateFromPrincipalCurvatures(k1, k2);
    }
    else if (r < 0.0)
    {
      // Dale Lear - March 2024 - RH-81078
      // We end up here when r < 0 and gaussian_curvature > 0.
      // We are in one of 3 cases:
      // 1) We are dealing with a very small and noisy negative r.
      // 2) We are dealing with esimates of mean and gaussian.        
      // 3) Something else that is uncommon.
      
      // In case 1, mean*mean and gaussian are both larger relative to fabs(r).
      // We don't know which input value is more precise, but people typically
      // care more about gaussian so we use k1=k2=sign(mean)*sqrt(gaussian) instead of
      // k1 = k2 = mean.
      // 
      // In case 2, the value of gaussian is typically more important than the value 
      // of mean, because people are often testing to see how a mesh can be flattened.
      //
      // So, we assume we are at or near an umbilic (k1=k2) and set them so that
      // k1*k2 = gaussian_curvature and sign(k1+k2) = sign(mean). 
      // These choices preserve gaussian minimize fabs( 0.5*(k1+k2) - mean_curvature).
      const double k1 = ((mean_curvature < 0.0) ? -1.0 : 1.0) * sqrt(gaussian_curvature);
      const double k2 = k1;
      return ON_SurfaceCurvature::CreateFromPrincipalCurvatures(k1, k2);
      // put a breakpoint on the line above to dectect when we are in
      // this unusual situation.
    } 
  }
  if (ON_IS_VALID(gaussian_curvature))
  {
    // It can happen that only Gaussian was estimated, whether on purpose or not.
    const double k1 = sqrt(fabs(gaussian_curvature));
    const double k2 = ((gaussian_curvature < 0.0) ? -1.0 : 1.0) * k1;
    return ON_SurfaceCurvature::CreateFromPrincipalCurvatures(k1, k2);
  }
  if (ON_IS_VALID(mean_curvature))
  {
    // It can also happen that only mean was estimated, whether on purpose or not.
    return ON_SurfaceCurvature::CreateFromPrincipalCurvatures(mean_curvature, mean_curvature);
  }
  return ON_SurfaceCurvature::Nan;
}